

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlfield.cpp
# Opt level: O3

void __thiscall QSqlField::setAutoValue(QSqlField *this,bool autoVal)

{
  QSqlFieldPrivate *pQVar1;
  
  pQVar1 = (this->d).d.ptr;
  if ((__int_type)
      (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int> != 1) {
    QExplicitlySharedDataPointer<QSqlFieldPrivate>::detach_helper(&this->d);
    pQVar1 = (this->d).d.ptr;
  }
  pQVar1->field_0x70 = pQVar1->field_0x70 & 0xfb | autoVal << 2;
  return;
}

Assistant:

void QSqlField::setAutoValue(bool autoVal)
{
    detach();
    d->autoval = autoVal;
}